

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::DrawNetWeb(BoardView *this,ImDrawList *draw)

{
  element_type *peVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar5;
  ImU32 col;
  undefined4 extraout_var;
  uint col_00;
  shared_ptr<Pin> *p;
  long *plVar6;
  bool bVar7;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if (this->showNetWeb == true) {
    peVar1 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((1 < *(uint *)&(peVar1->super_BoardElement).field_0xc) && (peVar1->net->is_ground == false))
    {
      iVar5 = (*this->m_board->_vptr_Board[4])();
      plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var,iVar5))[1];
      for (plVar6 = *(long **)CONCAT44(extraout_var,iVar5); plVar6 != plVar2; plVar6 = plVar6 + 2) {
        lVar3 = *plVar6;
        if (*(Net **)(lVar3 + 0x60) ==
            ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net)
        {
          col_00 = (this->m_colors).pinNetWebColor;
          lVar4 = *(long *)(lVar3 + 0x68);
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x70);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (lVar4 == 0) {
            bVar7 = true;
          }
          else {
            iVar5 = *(int *)(lVar4 + 8);
            bVar7 = iVar5 == 2 || iVar5 == this->m_current_side;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (!bVar7) {
            col_00 = (this->m_colors).pinNetWebOSColor;
            local_58._0_8_ =
                 CoordToScreen(this,*(float *)(*plVar6 + 0x50),*(float *)(*plVar6 + 0x54),1.0);
            ImDrawList::AddCircle
                      (draw,(ImVec2 *)&local_58,*(float *)(*plVar6 + 0x58) * this->m_scale,col_00,
                       0x10,1.0);
          }
          peVar1 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_38 = CoordToScreen(this,(peVar1->position).x,(peVar1->position).y,1.0);
          local_40 = CoordToScreen(this,*(float *)(*plVar6 + 0x50),*(float *)(*plVar6 + 0x54),1.0);
          local_58.y = (float)(col_00 >> 8 & 0xff) * 0.003921569;
          local_58.x = (float)(col_00 & 0xff) * 0.003921569;
          local_58.w = (float)(col_00 >> 0x18) * 0.003921569;
          local_58.z = (float)(col_00 >> 0x10 & 0xff) * 0.003921569;
          col = ImGui::ColorConvertFloat4ToU32(&local_58);
          ImDrawList::AddLine(draw,&local_38,&local_40,col,(float)this->netWebThickness);
        }
      }
    }
  }
  return;
}

Assistant:

void BoardView::DrawNetWeb(ImDrawList *draw) {
	if (!showNetWeb) return;

	/*
	 * Some nets we don't bother showing, because they're not relevant or
	 * produce too many results (such as ground!)
	 */
	if (m_pinSelected->type == Pin::kPinTypeNotConnected) return;
	if (m_pinSelected->type == Pin::kPinTypeUnkown) return;
	if (m_pinSelected->net->is_ground) return;

	for (auto &p : m_board->Pins()) {

		if (p->net == m_pinSelected->net) {
			uint32_t col = m_colors.pinNetWebColor;
			if (!BoardElementIsVisible(p->component)) {
				col = m_colors.pinNetWebOSColor;
				draw->AddCircle(CoordToScreen(p->position.x, p->position.y), p->diameter * m_scale, col, 16);
			}

			draw->AddLine(CoordToScreen(m_pinSelected->position.x, m_pinSelected->position.y),
			              CoordToScreen(p->position.x, p->position.y),
			              ImColor(col),
			              netWebThickness);
		}
	}

	return;
}